

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O2

matrix4d * tinyusdz::to_matrix(matrix4d *__return_storage_ptr__,quatf *q)

{
  undefined8 uVar1;
  double dVar2;
  double3x3 m33;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  mat<double,_3,_3> local_58;
  
  uVar1 = *(undefined8 *)(q->imag)._M_elems;
  dVar2 = (double)(float)((ulong)uVar1 >> 0x20);
  local_78._8_4_ = SUB84(dVar2,0);
  local_78._0_8_ = (double)(float)uVar1;
  local_78._12_4_ = (int)((ulong)dVar2 >> 0x20);
  uVar1 = *(undefined8 *)((q->imag)._M_elems + 2);
  dVar2 = (double)(float)((ulong)uVar1 >> 0x20);
  local_68._8_4_ = SUB84(dVar2,0);
  local_68._0_8_ = (double)(float)uVar1;
  local_68._12_4_ = (int)((ulong)dVar2 >> 0x20);
  linalg::qmat<double>(&local_58,(vec<double,_4> *)local_78);
  __return_storage_ptr__->m[0][0] = 1.0;
  __return_storage_ptr__->m[0][1] = 0.0;
  __return_storage_ptr__->m[0][2] = 0.0;
  __return_storage_ptr__->m[0][3] = 0.0;
  __return_storage_ptr__->m[1][0] = 0.0;
  __return_storage_ptr__->m[1][1] = 1.0;
  __return_storage_ptr__->m[1][2] = 0.0;
  __return_storage_ptr__->m[1][3] = 0.0;
  __return_storage_ptr__->m[2][0] = 0.0;
  __return_storage_ptr__->m[2][1] = 0.0;
  __return_storage_ptr__->m[2][2] = 1.0;
  __return_storage_ptr__->m[2][3] = 0.0;
  __return_storage_ptr__->m[3][0] = 0.0;
  __return_storage_ptr__->m[3][1] = 0.0;
  __return_storage_ptr__->m[3][2] = 0.0;
  __return_storage_ptr__->m[3][3] = 1.0;
  Identity(__return_storage_ptr__);
  __return_storage_ptr__->m[0][0] = local_58.x.x;
  __return_storage_ptr__->m[0][1] = local_58.x.y;
  __return_storage_ptr__->m[0][2] = local_58.x.z;
  __return_storage_ptr__->m[1][0] = local_58.y.x;
  __return_storage_ptr__->m[1][1] = local_58.y.y;
  __return_storage_ptr__->m[1][2] = local_58.y.z;
  __return_storage_ptr__->m[2][0] = local_58.z.x;
  __return_storage_ptr__->m[2][1] = local_58.z.y;
  __return_storage_ptr__->m[2][2] = local_58.z.z;
  return __return_storage_ptr__;
}

Assistant:

value::matrix4d to_matrix(const value::quatf &q) {
  double3x3 m33 = linalg::qmat<double>({double(q.imag[0]), double(q.imag[1]),
                                        double(q.imag[2]), double(q.real)});

  value::matrix4d m;
  Identity(&m);

  m.m[0][0] = m33[0][0];
  m.m[0][1] = m33[0][1];
  m.m[0][2] = m33[0][2];
  m.m[1][0] = m33[1][0];
  m.m[1][1] = m33[1][1];
  m.m[1][2] = m33[1][2];
  m.m[2][0] = m33[2][0];
  m.m[2][1] = m33[2][1];
  m.m[2][2] = m33[2][2];

  return m;
}